

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type __thiscall QList<QGridBox_*>::takeFirst(QList<QGridBox_*> *this)

{
  QGridBox **ppQVar1;
  QPodArrayOps<QGridBox_*> *this_00;
  QArrayDataPointer<QGridBox_*> *in_RDI;
  value_type v;
  QList<QGridBox_*> *in_stack_fffffffffffffff0;
  QGridBox *pQVar2;
  
  ppQVar1 = first(in_stack_fffffffffffffff0);
  pQVar2 = *ppQVar1;
  this_00 = (QPodArrayOps<QGridBox_*> *)QArrayDataPointer<QGridBox_*>::operator->(in_RDI);
  QtPrivate::QPodArrayOps<QGridBox_*>::eraseFirst(this_00);
  return pQVar2;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }